

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

void __thiscall FIX::DataDictionary::readFromStream(DataDictionary *this,istream *stream)

{
  char cVar1;
  tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_> this_00;
  ConfigError *this_01;
  DOMDocumentPtr pDoc;
  __uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> local_50;
  string local_48;
  
  this_00.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       operator_new(0xd8);
  PUGIXML_DOMDocument::PUGIXML_DOMDocument
            ((PUGIXML_DOMDocument *)
             this_00.
             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
             super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
  local_50._M_t.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       (tuple<FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>)
       this_00.super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
       super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  cVar1 = (**(code **)(*(long *)this_00.
                                super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                                .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl +
                      0x10))(this_00.
                             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                             .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,stream);
  if (cVar1 != '\0') {
    readFromDocument(this,(DOMDocumentPtr *)&local_50);
    (**(code **)(*(long *)this_00.
                          super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                          .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl + 8))
              (this_00.
               super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
               super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
    return;
  }
  this_01 = (ConfigError *)__cxa_allocate_exception(0x50);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not parse data dictionary stream","");
  ConfigError::ConfigError(this_01,&local_48);
  __cxa_throw(this_01,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());

  if (!pDoc->load(stream)) {
    throw ConfigError("Could not parse data dictionary stream");
  }

  readFromDocument(pDoc);
}